

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventloop.c
# Opt level: O3

void aura_eventloop_add(aura_eventloop *loop,aura_node *node)

{
  aura_eventloop *loop_00;
  list_head *plVar1;
  
  loop_00 = aura_node_eventloop_get(node);
  if (loop_00 != (aura_eventloop *)0x0) {
    if (node->evtloop_is_autocreated == 0) {
      BUG(node,"Specified node is already bound to an event-system");
    }
    slog(4,4,"eventloop: Node has an associated auto-created eventsystem, destroying...");
    aura_eventloop_destroy(loop_00);
  }
  plVar1 = (loop->nodelist).prev;
  (loop->nodelist).prev = &node->eventloop_node_list;
  (node->eventloop_node_list).next = &loop->nodelist;
  (node->eventloop_node_list).prev = plVar1;
  plVar1->next = &node->eventloop_node_list;
  aura_node_eventloop_set(node,loop);
  (*loop->module->node_added)(loop,node);
  aura_fd_changed_cb(node,eventloop_fd_changed_cb,loop);
  for (plVar1 = (node->timer_list).next; plVar1 != &node->timer_list; plVar1 = plVar1->next) {
    if (*(char *)((long)&plVar1[2].prev + 4) == '\x01') {
      *(undefined1 *)((long)&plVar1[2].prev + 4) = 0;
      aura_timer_start((aura_timer *)(plVar1 + -1),*(int *)&plVar1[2].prev,(timeval *)0x0);
    }
  }
  return;
}

Assistant:

void aura_eventloop_add(struct aura_eventloop *loop, struct aura_node *node)
{
	struct aura_eventloop *curloop = aura_node_eventloop_get(node);
	struct aura_timer *pos;

	/* Some sanity checking first */
	if ((curloop != NULL) && (!node->evtloop_is_autocreated))
		BUG(node, "Specified node is already bound to an event-system");

	if (curloop != NULL) {
		slog(4, SLOG_DEBUG, "eventloop: Node has an associated auto-created eventsystem, destroying...");
		aura_eventloop_destroy(curloop);
	}

	/* Link our next node into our list and adjust timeouts */
	list_add_tail(&node->eventloop_node_list, &loop->nodelist);
	aura_node_eventloop_set(node, loop);

	loop->module->node_added(loop, node);

	/* Set up our fdaction callback to handle descriptor changes */
	aura_fd_changed_cb(node, eventloop_fd_changed_cb, loop);

	/* Start all node's timers, if any */
	list_for_each_entry(pos, &node->timer_list, entry) {
		if (pos->is_active) {
			pos->is_active = false;
			aura_timer_start(pos, pos->flags, NULL);
		}
	}
}